

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNFOnTheFly.cpp
# Opt level: O0

Clause * Inferences::replaceLits
                   (Clause *c,Literal *a,Literal *b,InferenceRule r,bool incAge,Literal *d,
                   Literal *e)

{
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  i_00;
  undefined1 uVar1;
  Literal **ppLVar2;
  Stack<Kernel::Literal_*> *this;
  Clause *pCVar3;
  InferenceRule in_CL;
  Literal *in_RSI;
  Clause *in_RDI;
  byte in_R8B;
  long in_R9;
  long in_stack_00000008;
  Clause *out;
  Literal *l;
  StlIter __end1;
  StlIter __begin1;
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>_>
  *__range1;
  uint i;
  RStack<Literal_*> lits;
  StlIter *rhs;
  uint a_00;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *in_stack_fffffffffffffe90;
  Clause *pCVar4;
  Clause *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  Inference *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  NonspecificInference1 local_f8;
  Inference local_e8;
  Clause *local_b8;
  Literal *local_b0;
  StlIter *local_78;
  Clause *pCStack_70;
  undefined1 local_60 [24];
  undefined1 *local_48;
  int local_3c;
  long local_28;
  byte local_1a;
  InferenceRule local_19;
  Literal *local_10;
  Clause *local_8;
  
  local_1a = in_R8B & 1;
  local_28 = in_R9;
  local_19 = in_CL;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(in_stack_fffffffffffffe90);
  local_3c = 0;
  while (ppLVar2 = Kernel::Clause::operator[](local_8,local_3c), *ppLVar2 != local_10) {
    local_3c = local_3c + 1;
  }
  Kernel::Clause::iterLits(in_stack_fffffffffffffea0);
  i_00._iter._inner._next = (int)in_stack_fffffffffffffec8;
  i_00._iter._inner._from = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  i_00._iter._func.a = (Clause *)in_stack_fffffffffffffec0;
  i_00._iter._16_8_ = in_stack_fffffffffffffed0;
  Lib::
  iterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>>
            (i_00);
  local_48 = local_60;
  Lib::
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>_>
  ::begin((IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>_>
           *)local_78);
  Lib::
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>_>
  ::end((IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>_>
         *)local_78);
  rhs = local_78;
  pCVar4 = pCStack_70;
  while (uVar1 = Lib::operator!=((StlIter *)pCVar4,rhs), (bool)uVar1) {
    in_stack_fffffffffffffef8 =
         (Inference *)
         Lib::
         IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>_>
         ::StlIter::operator*((StlIter *)0x780ca3);
    local_b0 = *(Literal **)in_stack_fffffffffffffef8;
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                *)0x780cc7);
    Lib::Stack<Kernel::Literal_*>::push((Stack<Kernel::Literal_*> *)pCVar4,(Literal *)rhs);
    Lib::
    IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>_>
    ::StlIter::operator++((StlIter *)pCVar4);
  }
  if (local_28 != 0) {
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                *)0x780d54);
    Lib::Stack<Kernel::Literal_*>::push((Stack<Kernel::Literal_*> *)pCVar4,(Literal *)rhs);
  }
  if (in_stack_00000008 != 0) {
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                *)0x780d89);
    Lib::Stack<Kernel::Literal_*>::push((Stack<Kernel::Literal_*> *)pCVar4,(Literal *)rhs);
  }
  this = Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
         operator*((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)0x780db3);
  Kernel::NonspecificInference1::NonspecificInference1(&local_f8,local_19,&local_8->super_Unit);
  Kernel::Inference::Inference((Inference *)pCVar4,(NonspecificInference1 *)rhs);
  a_00 = (uint)((ulong)rhs >> 0x20);
  pCVar3 = Kernel::Clause::fromStack
                     ((Stack<Kernel::Literal_*> *)CONCAT17(uVar1,in_stack_ffffffffffffff00),
                      in_stack_fffffffffffffef8);
  Kernel::Inference::~Inference(&local_e8);
  local_b8 = pCVar3;
  if ((local_1a & 1) == 0) {
    Kernel::Clause::age((Clause *)0x780e67);
  }
  else {
    Kernel::Clause::age((Clause *)0x780e47);
  }
  Kernel::Clause::setAge(pCVar4,a_00);
  pCVar4 = local_b8;
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
            this);
  return pCVar4;
}

Assistant:

Clause* replaceLits(Clause *c, Literal *a, Literal *b, InferenceRule r, bool incAge, Literal *d, Literal* e)
{
  RStack<Literal*> lits;

  unsigned i = 0;
  while ((*c)[i] != a) { i++; }
  for (auto l : iterTraits(c->iterLits())) {
    lits->push(l == a ? b : l);
  }
  // adding new literals at differrent places...
  if (d) { lits->push(d); }
  if (e) { lits->push(e); }
  
  auto out = Clause::fromStack(*lits, NonspecificInference1(r, c));
  // Can be either generating or simplifying. Therefore use NonspecificInference
  // Age is updated in some instances, but not in others based on empirical evaluation
  out->setAge(incAge? c->age() + 1 : c->age());
  return out;
}